

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf-test.cpp
# Opt level: O1

void u_to_u8_test(int line,UTF_US16 *str1,UTF_S8 *str2,bool ok)

{
  bool bVar1;
  UTF_UC8 UVar2;
  int iVar3;
  UTF_RET UVar4;
  long lVar5;
  UTF_UC8 *uj8;
  UTF_US8 tmp;
  UTF_UC8 buf [256];
  UTF_US8 local_148;
  UTF_UC8 local_128 [256];
  
  local_148._M_string_length = 0;
  local_148.field_2._M_local_buf[0] = '\0';
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  bVar1 = UTF_u_to_u8<(char)63>(str1,&local_148);
  UTF_test(line,bVar1 == ok);
  iVar3 = std::__cxx11::
          basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
          ::compare(&local_148,
                    (basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                     *)str2);
  UTF_test(line,iVar3 == 0);
  uj8 = local_128;
  UVar4 = UTF_uj16_to_uj8((str1->_M_dataplus)._M_p,str1->_M_string_length,uj8,0x100);
  UTF_test(line,UVar4 == UTF_SUCCESS);
  UVar2 = *local_148._M_dataplus._M_p;
  if (UVar2 != '\0') {
    lVar5 = 0;
    do {
      if (local_128[lVar5] == '\0') break;
      bVar1 = local_148._M_string_length + 1 == lVar5;
      if ((UVar2 != local_128[lVar5]) || (local_148._M_string_length + 1 == lVar5))
      goto LAB_00101bd8;
      UVar2 = local_148._M_dataplus._M_p[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (UVar2 != '\0');
    uj8 = local_128 + lVar5;
  }
  bVar1 = UVar2 == *uj8;
LAB_00101bd8:
  UTF_test(line,bVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  return;
}

Assistant:

void u_to_u8_test(int line, const UTF_US16& str1, const UTF_S8& str2, bool ok)
{
    UTF_US8 tmp;
    UTF_UC8 buf[256];
    UTF_test(line, UTF_u_to_u8<'?'>(str1, tmp) == ok);
    UTF_test(line, tmp == reinterpret_cast<const UTF_US8&>(str2));
    UTF_test(line, UTF_uj16_to_uj8(str1.c_str(), str1.size(), buf, 256) == UTF_SUCCESS);
    UTF_test(line, UTF_uj8_cmpn(tmp.c_str(), buf, UTF_SIZE_T(tmp.size() + 1)) == 0);
}